

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CService::SetSockAddr(CService *this,sockaddr *paddr)

{
  bool bVar1;
  long in_FS_OFFSET;
  direct_or_indirect local_38;
  size_type local_28;
  undefined8 local_20;
  uint16_t local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (paddr->sa_family == 10) {
    CService((CService *)&local_38.indirect_contents,(sockaddr_in6 *)paddr);
  }
  else {
    if (paddr->sa_family != 2) {
      bVar1 = false;
      goto LAB_006d0edd;
    }
    CService((CService *)&local_38.indirect_contents,(sockaddr_in *)paddr);
  }
  if (0x10 < (this->super_CNetAddr).m_addr._size) {
    free((this->super_CNetAddr).m_addr._union.indirect_contents.indirect);
  }
  (this->super_CNetAddr).m_addr._union.indirect_contents.indirect =
       local_38.indirect_contents.indirect;
  *(undefined8 *)((long)&(this->super_CNetAddr).m_addr._union + 8) = local_38._8_8_;
  (this->super_CNetAddr).m_addr._size = local_28;
  local_28 = 0;
  (this->super_CNetAddr).m_net = (undefined4)local_20;
  (this->super_CNetAddr).m_scope_id = local_20._4_4_;
  this->port = local_18;
  bVar1 = true;
LAB_006d0edd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CService::SetSockAddr(const struct sockaddr *paddr)
{
    switch (paddr->sa_family) {
    case AF_INET:
        *this = CService(*(const struct sockaddr_in*)paddr);
        return true;
    case AF_INET6:
        *this = CService(*(const struct sockaddr_in6*)paddr);
        return true;
    default:
        return false;
    }
}